

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

int __thiscall QFileDevice::close(QFileDevice *this,int __fd)

{
  QObjectData *pQVar1;
  QRingBuffer *this_00;
  bool bVar2;
  byte bVar3;
  int extraout_EAX;
  FileError FVar4;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  bVar2 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar2) {
    bVar2 = flush(this);
    QIODevice::close(&this->super_QIODevice,__fd);
    *(undefined1 *)&pQVar1[5].parent = 0;
    this_00 = (QRingBuffer *)pQVar1[1].bindingStorage.bindingStatus;
    if (this_00 != (QRingBuffer *)0x0) {
      QRingBuffer::clear(this_00);
    }
    pQVar1[5]._vptr_QObjectData = (_func_int **)0x0;
    bVar3 = (*(code *)((pQVar1[4].bindingStorage.bindingStatus)->currentlyEvaluatingBinding->
                      alreadyCaptureProperties).
                      super_QVLABase<const_QtPrivate::QPropertyBindingData_*>.super_QVLABaseBase.a)
                      ();
    if ((bVar3 & bVar2) == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QFileDevicePrivate::setError
                  ((QFileDevicePrivate *)(this->super_QIODevice).super_QObject.d_ptr.d,NoError);
        return extraout_EAX;
      }
      goto LAB_0023893a;
    }
    if (bVar2) {
      FVar4 = QAbstractFileEngine::error
                        ((QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
      QAbstractFileEngine::errorString
                (&local_38,(QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
      *(FileError *)((long)&pQVar1[5].q_ptr + 4) = FVar4;
      QString::operator=((QString *)&pQVar1[4].children.d.size,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
LAB_0023893a:
  __stack_chk_fail();
}

Assistant:

void QFileDevice::close()
{
    Q_D(QFileDevice);
    if (!isOpen())
        return;
    bool flushed = flush();
    QIODevice::close();

    // reset write buffer
    d->lastWasWrite = false;
    d->writeBuffer.clear();

    // reset cached size
    d->cachedSize = 0;

    // If flush() succeeded but close() failed, copy its error condition;
    // otherwise, keep the earlier flush() error.
    if (d->fileEngine->close() && flushed)
        unsetError();
    else if (flushed)
        d->setError(d->fileEngine->error(), d->fileEngine->errorString());
}